

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall List::on_key_down(List *this,ALLEGRO_KEYBOARD_EVENT *event)

{
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  long in_RSI;
  long *in_RDI;
  
  uVar2 = (**(code **)(*in_RDI + 0x80))();
  if ((uVar2 & 1) == 0) {
    if (*(int *)(in_RSI + 0x20) == 0x54) {
      if ((int)in_RDI[10] != 0) {
        *(int *)(in_RDI + 10) = (int)in_RDI[10] + -1;
        Dialog::request_draw((Dialog *)in_RDI[3]);
      }
    }
    else if ((*(int *)(in_RSI + 0x20) == 0x55) &&
            (uVar1 = *(uint *)(in_RDI + 10),
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(in_RDI + 7)), (ulong)uVar1 < sVar3 - 1)) {
      *(int *)(in_RDI + 10) = (int)in_RDI[10] + 1;
      Dialog::request_draw((Dialog *)in_RDI[3]);
    }
  }
  return;
}

Assistant:

void List::on_key_down(const ALLEGRO_KEYBOARD_EVENT & event)
{
   if (is_disabled())
      return;

   switch (event.keycode) {
      case ALLEGRO_KEY_DOWN:
         if (selected_item < items.size() - 1) {
            selected_item++;
            dialog->request_draw();
         }
         break;

      case ALLEGRO_KEY_UP:
         if (selected_item > 0) {
            selected_item--;
            dialog->request_draw();
         }
         break;
   }
}